

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridAxisIrregular.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::GridAxisIrregular::AddXiValue(GridAxisIrregular *this,KUINT16 Xi)

{
  size_type sVar1;
  KUINT16 local_12;
  GridAxisIrregular *pGStack_10;
  KUINT16 Xi_local;
  GridAxisIrregular *this_local;
  
  local_12 = Xi;
  pGStack_10 = this;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
            (&this->m_vXiValues,&local_12);
  sVar1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size(&this->m_vXiValues);
  (this->super_GridAxisRegular).m_ui16NumPoints = (KUINT16)sVar1;
  calculatePadding(this);
  return;
}

Assistant:

void GridAxisIrregular::AddXiValue( KUINT16 Xi )
{
    m_vXiValues.push_back( Xi );
    m_ui16NumPoints = m_vXiValues.size();
    calculatePadding();
}